

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmarker.c
# Opt level: O0

void emit_jfif_app0(j_compress_ptr cinfo)

{
  undefined8 in_RDI;
  JPEG_MARKER mark;
  
  mark = (JPEG_MARKER)((ulong)in_RDI >> 0x20);
  emit_marker(cinfo,mark);
  emit_2bytes(cinfo,mark);
  emit_byte(cinfo,mark);
  emit_byte(cinfo,mark);
  emit_byte(cinfo,mark);
  emit_byte(cinfo,mark);
  emit_byte(cinfo,mark);
  emit_byte(cinfo,mark);
  emit_byte(cinfo,mark);
  emit_byte(cinfo,mark);
  emit_2bytes(cinfo,mark);
  emit_2bytes(cinfo,mark);
  emit_byte(cinfo,mark);
  emit_byte(cinfo,mark);
  return;
}

Assistant:

LOCAL(void)
emit_jfif_app0 (j_compress_ptr cinfo)
/* Emit a JFIF-compliant APP0 marker */
{
  /*
   * Length of APP0 block	(2 bytes)
   * Block ID			(4 bytes - ASCII "JFIF")
   * Zero byte			(1 byte to terminate the ID string)
   * Version Major, Minor	(2 bytes - major first)
   * Units			(1 byte - 0x00 = none, 0x01 = inch, 0x02 = cm)
   * Xdpu			(2 bytes - dots per unit horizontal)
   * Ydpu			(2 bytes - dots per unit vertical)
   * Thumbnail X size		(1 byte)
   * Thumbnail Y size		(1 byte)
   */
  
  emit_marker(cinfo, M_APP0);
  
  emit_2bytes(cinfo, 2 + 4 + 1 + 2 + 1 + 2 + 2 + 1 + 1); /* length */

  emit_byte(cinfo, 0x4A);	/* Identifier: ASCII "JFIF" */
  emit_byte(cinfo, 0x46);
  emit_byte(cinfo, 0x49);
  emit_byte(cinfo, 0x46);
  emit_byte(cinfo, 0);
  emit_byte(cinfo, cinfo->JFIF_major_version); /* Version fields */
  emit_byte(cinfo, cinfo->JFIF_minor_version);
  emit_byte(cinfo, cinfo->density_unit); /* Pixel size information */
  emit_2bytes(cinfo, (int) cinfo->X_density);
  emit_2bytes(cinfo, (int) cinfo->Y_density);
  emit_byte(cinfo, 0);		/* No thumbnail image */
  emit_byte(cinfo, 0);
}